

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O0

void __thiscall
mjs::native_error_exception::native_error_exception
          (native_error_exception *this,native_error_type type,wstring_view *stack_trace,
          string_view *msg)

{
  const_iterator __beg;
  const_iterator __end;
  allocator<wchar_t> local_59;
  wstring local_58 [32];
  wstring_view local_38;
  basic_string_view<char,_std::char_traits<char>_> *local_28;
  string_view *msg_local;
  wstring_view *stack_trace_local;
  native_error_exception *pnStack_10;
  native_error_type type_local;
  native_error_exception *this_local;
  
  local_28 = msg;
  msg_local = (string_view *)stack_trace;
  stack_trace_local._4_4_ = type;
  pnStack_10 = this;
  __beg = std::basic_string_view<char,_std::char_traits<char>_>::begin(msg);
  __end = std::basic_string_view<char,_std::char_traits<char>_>::end(local_28);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<char_const*,void>(local_58,__beg,__end,&local_59);
  local_38 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_58);
  native_error_exception(this,type,stack_trace,&local_38);
  std::__cxx11::wstring::~wstring(local_58);
  std::allocator<wchar_t>::~allocator(&local_59);
  return;
}

Assistant:

native_error_exception::native_error_exception(native_error_type type, const std::wstring_view& stack_trace, const std::string_view& msg)
    : native_error_exception{type, stack_trace, std::wstring{msg.begin(), msg.end()}} {
}